

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirstWorkingReporter.cpp
# Opt level: O3

void __thiscall
ApprovalTests::FirstWorkingReporter::FirstWorkingReporter
          (FirstWorkingReporter *this,
          vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
          *theReporters)

{
  pointer ppRVar1;
  pointer ppRVar2;
  shared_ptr<ApprovalTests::Reporter> local_38;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__FirstWorkingReporter_001b2118;
  (this->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reporters).
  super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppRVar2 = (theReporters->
            super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppRVar1 = (theReporters->
            super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppRVar2 != ppRVar1) {
    do {
      local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *ppRVar2;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ApprovalTests::Reporter*>
                (&local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      ::std::
      vector<std::shared_ptr<ApprovalTests::Reporter>,std::allocator<std::shared_ptr<ApprovalTests::Reporter>>>
      ::emplace_back<std::shared_ptr<ApprovalTests::Reporter>>
                ((vector<std::shared_ptr<ApprovalTests::Reporter>,std::allocator<std::shared_ptr<ApprovalTests::Reporter>>>
                  *)&this->reporters,&local_38);
      if (local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ppRVar2 = ppRVar2 + 1;
    } while (ppRVar2 != ppRVar1);
  }
  return;
}

Assistant:

FirstWorkingReporter::FirstWorkingReporter(const std::vector<Reporter*>& theReporters)
    {
        for (auto r : theReporters)
        {
            reporters.push_back(std::shared_ptr<Reporter>(r));
        }
    }